

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O0

void __thiscall
TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,ClassDeclaration *class_declaration)

{
  string local_58;
  Symbol local_38;
  ClassDeclaration *local_18;
  ClassDeclaration *class_declaration_local;
  TypeCheckingVisitor *this_local;
  
  local_18 = class_declaration;
  class_declaration_local = (ClassDeclaration *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)&class_declaration->class_name_);
  Symbol::Symbol(&local_38,&local_58);
  TraverseToChildByClassSymbol(this,&local_38);
  Symbol::~Symbol(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  TemplateVisitor<int>::Accept((TemplateVisitor<int> *)this,(Node *)local_18->declarations_);
  this->current_layer_ = this->current_layer_->parent_;
  return;
}

Assistant:

void TypeCheckingVisitor::Visit(ClassDeclaration* class_declaration) {
  TraverseToChildByClassSymbol(Symbol(class_declaration->class_name_));

  Accept(class_declaration->declarations_);

  current_layer_ = current_layer_->parent_;
}